

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::ForkBranchBase::~ForkBranchBase(ForkBranchBase *this)

{
  ForkBranchBase **ppFVar1;
  ForkHubBase *pFVar2;
  ForkBranchBase ***local_40;
  ForkBranchBase *this_local;
  
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_00c0d860;
  if (this->prevPtr != (ForkBranchBase **)0x0) {
    *this->prevPtr = this->next;
    ppFVar1 = this->prevPtr;
    if (this->next == (ForkBranchBase *)0x0) {
      pFVar2 = Own<kj::_::ForkHubBase,_kj::_::ForkHubBase>::operator->(&this->hub);
      local_40 = &pFVar2->tailBranch;
    }
    else {
      local_40 = &this->next->prevPtr;
    }
    *local_40 = ppFVar1;
  }
  Own<kj::_::ForkHubBase,_kj::_::ForkHubBase>::~Own(&this->hub);
  PromiseNode::~PromiseNode(&this->super_PromiseNode);
  return;
}

Assistant:

ForkBranchBase::~ForkBranchBase() noexcept(false) {
  if (prevPtr != nullptr) {
    // Remove from hub's linked list of branches.
    *prevPtr = next;
    (next == nullptr ? hub->tailBranch : next->prevPtr) = prevPtr;
  }
}